

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniformGradient.cpp
# Opt level: O2

void __thiscall OpenMD::UniformGradient::modifyForces(UniformGradient *this)

{
  AtomType *pAVar1;
  long lVar2;
  Mat3x3d *t2;
  bool bVar3;
  bool bVar4;
  Snapshot *pSVar5;
  double *pdVar6;
  Snapshot *t2_00;
  long lVar7;
  Atom *this_00;
  RealType RVar8;
  double dVar9;
  RealType fPot;
  double local_280;
  UniformGradient *local_278;
  Mat3x3d *local_270;
  MultipoleAdapter ma;
  FixedChargeAdapter fca;
  MoleculeIterator i;
  FluctuatingChargeAdapter fqa;
  Vector3d EF;
  Vector3d r;
  Vector3d f;
  Vector3d t;
  Vector3d D;
  RectMatrix<double,_3U,_3U> local_1c0;
  Mat3x3d Q;
  potVec longRangePotential;
  RectMatrix<double,_3U,_3U> local_f8;
  Vector<double,_7U> local_b0;
  RectMatrix<double,_3U,_3U> local_78;
  
  if (this->initialized == false) {
    initialize(this);
  }
  i._M_node = (_Base_ptr)0x0;
  Q.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  Vector<double,_7U>::Vector(&longRangePotential,(double *)&Q);
  Vector<double,_3U>::Vector(&D.super_Vector<double,_3U>);
  SquareMatrix<double,_3>::SquareMatrix(&Q.super_SquareMatrix<double,_3>);
  Vector<double,_3U>::Vector(&t.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&f.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&r.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&EF.super_Vector<double,_3U>);
  if (this->doUniformGradient == true) {
    fPot = 0.0;
    pSVar5 = (Snapshot *)SimInfo::beginMolecule((this->super_ForceModifier).info_,&i);
    local_270 = &this->Grad_;
    local_278 = this;
    while (pSVar5 != (Snapshot *)0x0) {
      pdVar6 = (double *)
               (((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                &(pSVar5->atomData).position.
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->
               super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((pointer)pdVar6 !=
          (pSVar5->atomData).velocity.
          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start) goto LAB_0014eec0;
      this_00 = (Atom *)0x0;
      while (this_00 != (Atom *)0x0) {
        pAVar1 = this_00->atomType_;
        t2_00 = pSVar5;
        StuntDouble::getPos((Vector3d *)&local_f8,&this_00->super_StuntDouble);
        Vector<double,_3U>::operator=(&r.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_f8);
        Snapshot::wrapVector
                  (((this->super_ForceModifier).info_)->sman_->currentSnapshot_,
                   (Vector3d *)&r.super_Vector<double,_3U>);
        operator*((Vector<double,_3U> *)&local_f8,(RectMatrix<double,_3U,_3U> *)local_270,
                  &r.super_Vector<double,_3U>);
        Vector3<double>::operator=
                  ((Vector3<double> *)&EF.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_f8);
        operator*((Vector<double,_3U> *)&local_1c0,&EF.super_Vector<double,_3U>,23.0609);
        Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_f8,(Vector<double,_3U> *)&local_1c0)
        ;
        StuntDouble::addElectricField(&this_00->super_StuntDouble,(Vector3d *)&local_f8);
        fca.at_ = pAVar1;
        bVar3 = FixedChargeAdapter::isFixedCharge(&fca);
        RVar8 = 0.0;
        if (bVar3) {
          RVar8 = FixedChargeAdapter::getCharge(&fca);
        }
        local_280 = RVar8;
        fqa.at_ = pAVar1;
        bVar4 = FluctuatingChargeAdapter::isFluctuatingCharge(&fqa);
        if (bVar4) {
          local_280 = local_280 +
                      *(double *)
                       (*(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->
                                          currentSnapshot_->atomData).flucQPos.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start +
                                 (this_00->super_StuntDouble).storage_) +
                       (long)(this_00->super_StuntDouble).localIndex_ * 8);
          dVar9 = dot<double,3u>(&r.super_Vector<double,_3U>,&EF.super_Vector<double,_3U>);
          t2_00 = ((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_;
          lVar7 = (long)(this_00->super_StuntDouble).localIndex_;
          lVar2 = *(long *)((long)&(t2_00->atomData).flucQFrc.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start +
                           (this_00->super_StuntDouble).storage_);
          *(double *)(lVar2 + lVar7 * 8) = dVar9 * 23.0609 + *(double *)(lVar2 + lVar7 * 8);
LAB_0014ec2c:
          this = local_278;
          operator*((Vector<double,_3U> *)&local_1c0,&EF.super_Vector<double,_3U>,local_280);
          operator*((Vector<double,_3U> *)&local_f8,(Vector<double,_3U> *)&local_1c0,23.0609);
          Vector3<double>::operator=
                    ((Vector3<double> *)&f.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_f8)
          ;
          StuntDouble::addFrc(&this_00->super_StuntDouble,(Vector3d *)&f.super_Vector<double,_3U>);
          dVar9 = dot<double,3u>(&r.super_Vector<double,_3U>,&f.super_Vector<double,_3U>);
          if (this->doParticlePot == true) {
            t2_00 = ((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_;
            lVar7 = (long)(this_00->super_StuntDouble).localIndex_;
            lVar2 = *(long *)((long)&(t2_00->atomData).particlePot.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start +
                             (this_00->super_StuntDouble).storage_);
            *(double *)(lVar2 + lVar7 * 8) = *(double *)(lVar2 + lVar7 * 8) - dVar9;
          }
          fPot = fPot - dVar9;
        }
        else {
          this = local_278;
          if (bVar3) goto LAB_0014ec2c;
        }
        ma.at_ = pAVar1;
        bVar3 = MultipoleAdapter::isDipole(&ma);
        if (bVar3) {
          StuntDouble::getDipole((Vector3d *)&local_1c0,&this_00->super_StuntDouble);
          operator*((Vector<double,_3U> *)&local_f8,(Vector<double,_3U> *)&local_1c0,4.8018969509);
          Vector3<double>::operator=
                    ((Vector3<double> *)&D.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_f8)
          ;
          operator*((Vector<double,_3U> *)&local_f8,&D.super_Vector<double,_3U>,
                    (RectMatrix<double,_3U,_3U> *)local_270);
          Vector3<double>::operator=(&f,(Vector<double,_3U> *)&local_f8);
          StuntDouble::addFrc(&this_00->super_StuntDouble,&f);
          cross<double>((Vector3<double> *)&local_f8,(Vector3<double> *)&D.super_Vector<double,_3U>,
                        (Vector3<double> *)&EF.super_Vector<double,_3U>);
          Vector<double,_3U>::operator=(&t.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_f8)
          ;
          this = local_278;
          StuntDouble::addTrq(&this_00->super_StuntDouble,(Vector3d *)&t.super_Vector<double,_3U>);
          dVar9 = dot<double,3u>(&D.super_Vector<double,_3U>,&EF.super_Vector<double,_3U>);
          if (this->doParticlePot == true) {
            t2_00 = ((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_;
            lVar7 = (long)(this_00->super_StuntDouble).localIndex_;
            lVar2 = *(long *)((long)&(t2_00->atomData).particlePot.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start +
                             (this_00->super_StuntDouble).storage_);
            *(double *)(lVar2 + lVar7 * 8) = *(double *)(lVar2 + lVar7 * 8) - dVar9;
          }
          fPot = fPot - dVar9;
        }
        bVar3 = MultipoleAdapter::isQuadrupole(&ma);
        if (bVar3) {
          StuntDouble::getQuadrupole((Mat3x3d *)&local_78,&this_00->super_StuntDouble);
          operator*(&local_1c0,&local_78,4.8018969509);
          RectMatrix<double,_3U,_3U>::operator=(&local_f8,&local_1c0);
          SquareMatrix3<double>::operator=
                    ((SquareMatrix3<double> *)&Q,(SquareMatrix<double,_3> *)&local_f8);
          t2 = local_270;
          mCross<double,3u,3u>
                    ((Vector<double,_3U> *)&local_1c0,(OpenMD *)&Q,
                     (RectMatrix<double,_3U,_3U> *)local_270,(RectMatrix<double,_3U,_3U> *)t2_00);
          operator*((Vector<double,_3U> *)&local_f8,2.0,(Vector<double,_3U> *)&local_1c0);
          Vector3<double>::operator=(&t,(Vector<double,_3U> *)&local_f8);
          StuntDouble::addTrq(&this_00->super_StuntDouble,&t);
          dVar9 = doubleDot<double,3u,3u>
                            ((RectMatrix<double,_3U,_3U> *)&Q,(RectMatrix<double,_3U,_3U> *)t2);
          if (this->doParticlePot == true) {
            lVar7 = (long)(this_00->super_StuntDouble).localIndex_;
            lVar2 = *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                     ->atomData).particlePot.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start +
                             (this_00->super_StuntDouble).storage_);
            *(double *)(lVar2 + lVar7 * 8) = *(double *)(lVar2 + lVar7 * 8) - dVar9;
          }
          fPot = fPot - dVar9;
        }
        pdVar6 = pdVar6 + 1;
        this_00 = (Atom *)0x0;
        if ((pointer)pdVar6 !=
            (pSVar5->atomData).velocity.
            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start) {
LAB_0014eec0:
          this_00 = (Atom *)*pdVar6;
        }
      }
      pSVar5 = (Snapshot *)SimInfo::nextMolecule((this->super_ForceModifier).info_,&i);
    }
    MPI_Allreduce(1,&fPot,1,&ompi_mpi_double,&ompi_mpi_op_sum,&ompi_mpi_comm_world);
    pSVar5 = ((this->super_ForceModifier).info_)->sman_->currentSnapshot_;
    Snapshot::getLongRangePotentials((potVec *)&local_f8,pSVar5);
    Vector<double,_7U>::operator=(&longRangePotential,(Vector<double,_7U> *)&local_f8);
    longRangePotential.data_[2] = fPot + longRangePotential.data_[2];
    Vector<double,_7U>::Vector(&local_b0,&longRangePotential);
    Snapshot::setLongRangePotentials(pSVar5,&local_b0);
  }
  return;
}

Assistant:

void UniformGradient::modifyForces() {
    if (!initialized) initialize();

    SimInfo::MoleculeIterator i;
    Molecule::AtomIterator j;
    Molecule* mol;
    Atom* atom;
    AtomType* atype;
    potVec longRangePotential(0.0);

    RealType C;
    Vector3d D;
    Mat3x3d Q;

    RealType U;
    RealType fPot;
    Vector3d t;
    Vector3d f;

    Vector3d r;
    Vector3d EF;

    bool isCharge;

    if (doUniformGradient) {
      U    = 0.0;
      fPot = 0.0;

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (atom = mol->beginAtom(j); atom != NULL; atom = mol->nextAtom(j)) {
          isCharge = false;
          C        = 0.0;

          atype = atom->getAtomType();

          r = atom->getPos();
          info_->getSnapshotManager()->getCurrentSnapshot()->wrapVector(r);

          EF = Grad_ * r;

          atom->addElectricField(EF * Constants::chargeFieldConvert);

          FixedChargeAdapter fca = FixedChargeAdapter(atype);
          if (fca.isFixedCharge()) {
            isCharge = true;
            C        = fca.getCharge();
          }

          FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atype);
          if (fqa.isFluctuatingCharge()) {
            isCharge = true;
            C += atom->getFlucQPos();
            atom->addFlucQFrc(dot(r, EF) * Constants::chargeFieldConvert);
          }

          if (isCharge) {
            f = EF * C * Constants::chargeFieldConvert;
            atom->addFrc(f);

            U = -dot(r, f);
            if (doParticlePot) { atom->addParticlePot(U); }
            fPot += U;
          }

          MultipoleAdapter ma = MultipoleAdapter(atype);
          if (ma.isDipole()) {
            D = atom->getDipole() * Constants::dipoleFieldConvert;

            f = D * Grad_;
            atom->addFrc(f);

            t = cross(D, EF);
            atom->addTrq(t);

            U = -dot(D, EF);
            if (doParticlePot) { atom->addParticlePot(U); }
            fPot += U;
          }

          if (ma.isQuadrupole()) {
            Q = atom->getQuadrupole() * Constants::dipoleFieldConvert;

            t = 2.0 * mCross(Q, Grad_);
            atom->addTrq(t);

            U = -doubleDot(Q, Grad_);
            if (doParticlePot) { atom->addParticlePot(U); }
            fPot += U;
          }
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &fPot, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
#endif

      Snapshot* snap     = info_->getSnapshotManager()->getCurrentSnapshot();
      longRangePotential = snap->getLongRangePotentials();
      longRangePotential[ELECTROSTATIC_FAMILY] += fPot;
      snap->setLongRangePotentials(longRangePotential);
    }
  }